

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O0

double betacdf(double x,double a,double b)

{
  undefined8 local_28;
  double oup;
  double b_local;
  double a_local;
  double x_local;
  
  local_28 = ibeta(x,a,b);
  if (1.0 < local_28) {
    local_28 = 1.0;
  }
  return local_28;
}

Assistant:

double betacdf(double x, double a , double b) {
	
	double oup;
	oup = ibeta(x,a,b);
	// Since ibeta's method 2 uses approximation it is possible that
	// the cdf function thus calculated may slightly overshoot 1.0 probability
	// value so we check for any discrepancies and correct them.
	
	if (oup > 1.0) {
		oup = 1.0;
	}
	return oup;
	
}